

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall
r_code::list<r_exec::HLPController::EEntry>::push_front
          (list<r_exec::HLPController::EEntry> *this,EEntry *t)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  
  if (this->free_cell_count == 0) {
    push_front_new_cell(this,t);
  }
  else {
    push_front_free_cell(this,t);
  }
  pcVar1 = (this->cells).
           super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = this->used_cells_head;
  lVar3 = pcVar1[lVar2].next;
  if (lVar3 != -1) {
    pcVar1[lVar3].prev = lVar2;
  }
  if (this->used_cells_tail == -1) {
    this->used_cells_tail = lVar2;
  }
  this->used_cell_count = this->used_cell_count + 1;
  return;
}

Assistant:

void push_front(const T &t)
    {
        if (free_cell_count) {
            push_front_free_cell(t);
        } else {
            push_front_new_cell(t);
        }

        update_used_cells_head_state();
    }